

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

QList<QAccessibleInterface_*> * __thiscall
QAccessibleList::selectedCells
          (QList<QAccessibleInterface_*> *__return_storage_ptr__,QAccessibleList *this)

{
  QAccessibleObject *pQVar1;
  int iVar2;
  int iVar3;
  QAbstractItemView *this_00;
  QAbstractItemView *this_01;
  QItemSelectionModel *pQVar4;
  QListView *this_02;
  QModelIndexList *__range1;
  undefined1 *asize;
  P _a;
  long lVar5;
  long in_FS_OFFSET;
  QAccessibleInterface *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &(this->super_QAccessibleTable).super_QAccessibleObject;
  (**(code **)(*(long *)&(this->super_QAccessibleTable).super_QAccessibleObject + 0x18))(pQVar1);
  this_00 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QAccessibleInterface **)0x0;
  (__return_storage_ptr__->d).size = 0;
  (**(code **)(*(long *)&(this->super_QAccessibleTable).super_QAccessibleObject + 0x18))(pQVar1);
  this_01 = (QAbstractItemView *)QMetaObject::cast((QObject *)&QAbstractItemView::staticMetaObject);
  pQVar4 = QAbstractItemView::selectionModel(this_01);
  if ((pQVar4 != (QItemSelectionModel *)0x0) &&
     (iVar2 = (**(code **)(*(long *)&this->super_QAccessibleTable + 0x58))(this), iVar2 != 0)) {
    this_02 = (QListView *)QMetaObject::cast((QObject *)&QListView::staticMetaObject);
    iVar2 = QListView::modelColumn(this_02);
    QAbstractItemView::selectionModel(this_00);
    QItemSelectionModel::selectedIndexes();
    iVar3 = (**(code **)(*(long *)&this->super_QAccessibleTable + 0x60))(this);
    asize = (undefined1 *)(long)iVar3;
    if (-0x5555555555555556 < (long)iVar3) {
      asize = &DAT_aaaaaaaaaaaaaaaa;
    }
    QList<QAccessibleInterface_*>::reserve(__return_storage_ptr__,(qsizetype)asize);
    lVar5 = 0;
    do {
      if (*(int *)(&DAT_aaaaaaaaaaaaaaae + lVar5) == iVar2) {
        local_40 = (QAccessibleInterface *)
                   (**(code **)(*(long *)&this->super_QAccessibleTable + 0x100))
                             (this,*(undefined4 *)(&DAT_aaaaaaaaaaaaaaaa + lVar5));
        QtPrivate::QPodArrayOps<QAccessibleInterface*>::emplace<QAccessibleInterface*&>
                  ((QPodArrayOps<QAccessibleInterface*> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_40);
        QList<QAccessibleInterface_*>::end(__return_storage_ptr__);
      }
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != -0x10);
    LOCK();
    _DAT_aaaaaaaaaaaaaaaa = _DAT_aaaaaaaaaaaaaaaa + -1;
    UNLOCK();
    if (_DAT_aaaaaaaaaaaaaaaa == 0) {
      QArrayData::deallocate((QArrayData *)&DAT_aaaaaaaaaaaaaaaa,0x18,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QAccessibleInterface *> QAccessibleList::selectedCells() const
{
    QAbstractItemView *theView = view();
    QList<QAccessibleInterface*> cells;
    if (!view()->selectionModel() || columnCount() == 0)
        return cells;
    const QListView *listView = qobject_cast<const QListView*>(theView);
    const int modelColumn = listView->modelColumn();
    const QModelIndexList selectedIndexes = theView->selectionModel()->selectedIndexes();
    cells.reserve(qMin(selectedIndexes.size(), rowCount()));
    for (const QModelIndex &index : selectedIndexes)
        if (index.column() == modelColumn) {
            cells.append(child(index.row()));
        }
    return cells;
}